

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_list.cxx
# Opt level: O2

void fl_filename_free_list(dirent ***list,int n)

{
  ulong uVar1;
  
  if (-1 < n) {
    for (uVar1 = 0; (uint)n != uVar1; uVar1 = uVar1 + 1) {
      free((*list)[uVar1]);
    }
    free(*list);
    *list = (dirent **)0x0;
  }
  return;
}

Assistant:

void fl_filename_free_list(struct dirent ***list, int n)
{
  if (n<0) return;
  
  int i;
  for (i = 0; i < n; i ++) {
    if ((*list)[i])
      free((*list)[i]);
  }  
  free(*list);
  *list = 0;
}